

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_rep(lua_State *L)

{
  undefined1 auVar1 [16];
  int iVar2;
  char *__src;
  char *__src_00;
  char *pcVar3;
  char *local_2070;
  char *p;
  luaL_Buffer b;
  size_t totallen;
  char *sep;
  lua_Integer n;
  char *s;
  size_t lsep;
  size_t l;
  lua_State *L_local;
  
  l = (size_t)L;
  __src = luaL_checklstring(L,1,&lsep);
  sep = (char *)luaL_checkinteger((lua_State *)l,2);
  __src_00 = luaL_optlstring((lua_State *)l,3,"",(size_t *)&s);
  if ((long)sep < 1) {
    lua_pushstring((lua_State *)l,"");
  }
  else {
    if ((s + lsep < lsep) ||
       (auVar1._8_8_ = 0, auVar1._0_8_ = sep,
       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffff)) / auVar1,0) < s + lsep)) {
      iVar2 = luaL_error((lua_State *)l,"resulting string too large");
      return iVar2;
    }
    b.initb._8184_8_ = (long)sep * lsep + (long)(sep + -1) * (long)s;
    local_2070 = luaL_buffinitsize((lua_State *)l,(luaL_Buffer *)&p,b.initb._8184_8_);
    while (pcVar3 = sep + -1, 1 < (long)sep) {
      memcpy(local_2070,__src,lsep);
      local_2070 = local_2070 + lsep;
      sep = pcVar3;
      if (s != (char *)0x0) {
        memcpy(local_2070,__src_00,(size_t)s);
        local_2070 = s + (long)local_2070;
      }
    }
    memcpy(local_2070,__src,lsep);
    luaL_pushresultsize((luaL_Buffer *)&p,b.initb._8184_8_);
  }
  return 1;
}

Assistant:

static int str_rep(lua_State *L) {
    size_t l, lsep;
    const char *s = luaL_checklstring(L, 1, &l);
    lua_Integer n = luaL_checkinteger(L, 2);
    const char *sep = luaL_optlstring(L, 3, "", &lsep);
    if (n <= 0) lua_pushliteral(L, "");
    else if (l + lsep < l || l + lsep > MAXSIZE / n)  /* may overflow? */
        return luaL_error(L, "resulting string too large");
    else {
        size_t totallen = (size_t) n * l + (size_t) (n - 1) * lsep;
        luaL_Buffer b;
        char *p = luaL_buffinitsize(L, &b, totallen);
        while (n-- > 1) {  /* first n-1 copies (followed by separator) */
            memcpy(p, s, l * sizeof(char));
            p += l;
            if (lsep > 0) {  /* empty 'memcpy' is not that cheap */
                memcpy(p, sep, lsep * sizeof(char));
                p += lsep;
            }
        }
        memcpy(p, s, l * sizeof(char));  /* last copy (not followed by separator) */
        luaL_pushresultsize(&b, totallen);
    }
    return 1;
}